

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

UChar * __thiscall
icu_63::BMPSet::span(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  int32_t lo;
  int32_t hi;
  int32_t iVar2;
  int32_t iVar3;
  uint uVar4;
  int32_t iVar5;
  int32_t iVar6;
  UChar *pUVar7;
  
  lo = this->list4kStarts[0x10];
  hi = this->list4kStarts[0x11];
  iVar2 = this->list4kStarts[0xd];
  iVar3 = this->list4kStarts[0xe];
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      UVar1 = *s;
      uVar4 = (uint)(ushort)UVar1;
      pUVar7 = s;
      if (uVar4 < 0x100) {
        if (this->latin1Contains[(ushort)UVar1] != '\0') {
          return s;
        }
      }
      else {
        if (uVar4 < 0x800) {
          uVar4 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f);
        }
        else {
          if ((ushort)(UVar1 + L'\x2000') < 0xf800) {
            uVar4 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                    (byte)((ushort)UVar1 >> 0xc) & 0x10001;
            if (uVar4 < 2) {
              if (uVar4 != 0) {
                return s;
              }
              goto LAB_002df088;
            }
            iVar6 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar5 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
          }
          else {
            iVar6 = iVar2;
            iVar5 = iVar3;
            if (((uVar4 < 0xdc00) && (pUVar7 = s + 1, pUVar7 != limit)) &&
               (0xfbff < ((ushort)*pUVar7 + 0x2000 & 0xffff))) {
              uVar4 = findCodePoint(this,uVar4 * 0x400 + (uint)(ushort)*pUVar7 + -0x35fdc00,lo,hi);
              goto joined_r0x002df086;
            }
          }
          uVar4 = findCodePoint(this,(uint)(ushort)UVar1,iVar6,iVar5);
          pUVar7 = s;
        }
joined_r0x002df086:
        if ((uVar4 & 1) != 0) {
          return s;
        }
      }
LAB_002df088:
      s = pUVar7 + 1;
    } while (s < limit);
  }
  else {
    do {
      UVar1 = *s;
      pUVar7 = s;
      if ((ushort)UVar1 < 0x100) {
        if (this->latin1Contains[(ushort)UVar1] == '\0') {
          return s;
        }
      }
      else {
        if ((ushort)UVar1 < 0x800) {
          uVar4 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f);
        }
        else {
          if ((ushort)(UVar1 + L'\x2000') < 0xf800) {
            uVar4 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                    (byte)((ushort)UVar1 >> 0xc) & 0x10001;
            if (uVar4 < 2) {
              if (uVar4 == 0) {
                return s;
              }
              goto LAB_002def5d;
            }
            iVar6 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar5 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
          }
          else {
            iVar6 = iVar2;
            iVar5 = iVar3;
            if ((((ushort)UVar1 < 0xdc00) && (pUVar7 = s + 1, pUVar7 != limit)) &&
               (0xfbff < (ushort)(*pUVar7 + L'\x2000'))) {
              uVar4 = findCodePoint(this,(uint)(ushort)UVar1 * 0x400 + (uint)(ushort)*pUVar7 +
                                         -0x35fdc00,lo,hi);
              goto joined_r0x002def57;
            }
          }
          uVar4 = findCodePoint(this,(uint)(ushort)UVar1,iVar6,iVar5);
          pUVar7 = s;
        }
joined_r0x002def57:
        if ((uVar4 & 1) == 0) {
          return s;
        }
      }
LAB_002def5d:
      s = pUVar7 + 1;
    } while (s < limit);
  }
  return s;
}

Assistant:

const UChar *
BMPSet::span(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        do {
            c=*s;
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    } else {
        // span not
        do {
            c=*s;
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    }
    return s;
}